

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaBlockMetadata::PrintDetailedMap_UnusedRange
          (VmaBlockMetadata *this,VmaJsonWriter *json,VkDeviceSize offset,VkDeviceSize size)

{
  VmaJsonWriter::BeginObject(json,true);
  VmaJsonWriter::WriteString(json,"Offset");
  VmaJsonWriter::WriteNumber(json,offset);
  VmaJsonWriter::WriteString(json,"Type");
  VmaJsonWriter::WriteString(json,"FREE");
  VmaJsonWriter::WriteString(json,"Size");
  VmaJsonWriter::WriteNumber(json,size);
  VmaJsonWriter::EndObject(json);
  return;
}

Assistant:

void VmaBlockMetadata::PrintDetailedMap_UnusedRange(class VmaJsonWriter& json,
    VkDeviceSize offset, VkDeviceSize size) const
{
    json.BeginObject(true);

    json.WriteString("Offset");
    json.WriteNumber(offset);

    json.WriteString("Type");
    json.WriteString(VMA_SUBALLOCATION_TYPE_NAMES[VMA_SUBALLOCATION_TYPE_FREE]);

    json.WriteString("Size");
    json.WriteNumber(size);

    json.EndObject();
}